

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrRenderer.cpp
# Opt level: O3

void rr::(anonymous_namespace)::
     drawBasicPrimitives<std::vector<rr::pa::Point,std::allocator<rr::pa::Point>>>
               (RenderState *state,RenderTarget *renderTarget,Program *program,
               vector<rr::pa::Point,_std::allocator<rr::pa::Point>_> *primList,
               VertexPacketAllocator *vpalloc)

{
  float fVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined8 uVar4;
  int iVar7;
  pointer pPVar8;
  pointer pFVar9;
  pointer pFVar10;
  VertexPacket *pVVar11;
  pointer pPVar12;
  pointer pPVar13;
  FragmentPacket *fragmentPackets;
  pointer pFVar14;
  ulong uVar15;
  float *pfVar16;
  pointer pPVar17;
  long lVar18;
  float *fragmentDepths_;
  pointer pPVar19;
  uint uVar20;
  uint uVar21;
  uint uVar22;
  uint uVar23;
  float fVar24;
  uint uVar27;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  FaceType in_stack_fffffffffffffc98;
  int numRasterizedPackets;
  undefined1 local_358 [16];
  int local_33c;
  undefined1 local_338 [8];
  float fStack_330;
  float fStack_32c;
  pointer local_328;
  RenderTarget *local_320;
  vector<rr::GenericVec4,_std::allocator<rr::GenericVec4>_> local_318;
  vector<rr::pa::Point,_std::allocator<rr::pa::Point>_> *local_2f8;
  RasterizationState *local_2f0;
  undefined1 local_2e8 [16];
  pointer local_2d8;
  undefined1 local_2c8 [16];
  undefined1 local_2b8 [8];
  undefined1 auStack_2b0 [16];
  pointer pGStack_2a0;
  undefined1 local_298 [16];
  pointer local_288;
  float *local_280;
  GenericVec4 *local_270;
  undefined8 local_268;
  undefined8 local_260;
  float local_258;
  float local_254;
  undefined8 local_250;
  float local_248;
  float local_244;
  undefined8 local_240;
  IVec4 local_238;
  undefined8 local_228;
  undefined8 uStack_220;
  vector<rr::pa::Point,_std::allocator<rr::pa::Point>_> visiblePoints;
  FragmentShadingContext shadingContext;
  TriangleRasterizer rasterizer2;
  
  visiblePoints.super__Vector_base<rr::pa::Point,_std::allocator<rr::pa::Point>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  visiblePoints.super__Vector_base<rr::pa::Point,_std::allocator<rr::pa::Point>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  visiblePoints.super__Vector_base<rr::pa::Point,_std::allocator<rr::pa::Point>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pPVar17 = (primList->super__Vector_base<rr::pa::Point,_std::allocator<rr::pa::Point>_>)._M_impl.
            super__Vector_impl_data._M_start;
  pPVar12 = (primList->super__Vector_base<rr::pa::Point,_std::allocator<rr::pa::Point>_>)._M_impl.
            super__Vector_impl_data._M_finish;
  pPVar13 = pPVar12;
  local_320 = renderTarget;
  if ((state->fragOps).depthClampEnabled == false) {
    if (pPVar12 == pPVar17) {
      visiblePoints.super__Vector_base<rr::pa::Point,_std::allocator<rr::pa::Point>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      visiblePoints.super__Vector_base<rr::pa::Point,_std::allocator<rr::pa::Point>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      visiblePoints.super__Vector_base<rr::pa::Point,_std::allocator<rr::pa::Point>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      pPVar19 = pPVar17;
    }
    else {
      uVar15 = 0;
      do {
        pVVar11 = pPVar17[uVar15].v0;
        fVar24 = (pVVar11->position).m_data[2];
        fVar1 = (pVVar11->position).m_data[3];
        if ((-fVar1 <= fVar24) && (fVar24 <= fVar1)) {
          rasterizer2.m_viewport.m_data._0_8_ = pVVar11;
          std::vector<rr::pa::Point,_std::allocator<rr::pa::Point>_>::emplace_back<rr::pa::Point>
                    (&visiblePoints,(Point *)&rasterizer2);
          pPVar17 = (primList->super__Vector_base<rr::pa::Point,_std::allocator<rr::pa::Point>_>).
                    _M_impl.super__Vector_impl_data._M_start;
          pPVar12 = (primList->super__Vector_base<rr::pa::Point,_std::allocator<rr::pa::Point>_>).
                    _M_impl.super__Vector_impl_data._M_finish;
        }
        uVar15 = uVar15 + 1;
        pPVar19 = pPVar17;
      } while (uVar15 < (ulong)((long)pPVar12 - (long)pPVar17 >> 3));
    }
    pPVar8 = (primList->super__Vector_base<rr::pa::Point,_std::allocator<rr::pa::Point>_>)._M_impl.
             super__Vector_impl_data._M_end_of_storage;
    (primList->super__Vector_base<rr::pa::Point,_std::allocator<rr::pa::Point>_>)._M_impl.
    super__Vector_impl_data._M_start =
         visiblePoints.super__Vector_base<rr::pa::Point,_std::allocator<rr::pa::Point>_>._M_impl.
         super__Vector_impl_data._M_start;
    (primList->super__Vector_base<rr::pa::Point,_std::allocator<rr::pa::Point>_>)._M_impl.
    super__Vector_impl_data._M_finish =
         visiblePoints.super__Vector_base<rr::pa::Point,_std::allocator<rr::pa::Point>_>._M_impl.
         super__Vector_impl_data._M_finish;
    (primList->super__Vector_base<rr::pa::Point,_std::allocator<rr::pa::Point>_>)._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         visiblePoints.super__Vector_base<rr::pa::Point,_std::allocator<rr::pa::Point>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage;
    pPVar13 = visiblePoints.super__Vector_base<rr::pa::Point,_std::allocator<rr::pa::Point>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    pPVar17 = visiblePoints.super__Vector_base<rr::pa::Point,_std::allocator<rr::pa::Point>_>.
              _M_impl.super__Vector_impl_data._M_start;
    visiblePoints.super__Vector_base<rr::pa::Point,_std::allocator<rr::pa::Point>_>._M_impl.
    super__Vector_impl_data._M_start = pPVar19;
    visiblePoints.super__Vector_base<rr::pa::Point,_std::allocator<rr::pa::Point>_>._M_impl.
    super__Vector_impl_data._M_finish = pPVar12;
    visiblePoints.super__Vector_base<rr::pa::Point,_std::allocator<rr::pa::Point>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = pPVar8;
    if (pPVar19 != (pointer)0x0) {
      operator_delete(pPVar19,(long)pPVar8 - (long)pPVar19);
      pPVar17 = (primList->super__Vector_base<rr::pa::Point,_std::allocator<rr::pa::Point>_>).
                _M_impl.super__Vector_impl_data._M_start;
      pPVar13 = (primList->super__Vector_base<rr::pa::Point,_std::allocator<rr::pa::Point>_>).
                _M_impl.super__Vector_impl_data._M_finish;
    }
  }
  if (pPVar17 != pPVar13) {
    do {
      anon_unknown_19::transformVertexClipCoordsToWindowCoords(state,pPVar17->v0);
      pPVar17 = pPVar17 + 1;
    } while (pPVar17 !=
             (primList->super__Vector_base<rr::pa::Point,_std::allocator<rr::pa::Point>_>)._M_impl.
             super__Vector_impl_data._M_finish);
  }
  iVar7 = *(int *)&local_320->field_0x8;
  pFVar9 = (program->fragmentShader->m_outputs).
           super__Vector_base<rr::FragmentOutputInfo,_std::allocator<rr::FragmentOutputInfo>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  pFVar10 = (program->fragmentShader->m_outputs).
            super__Vector_base<rr::FragmentOutputInfo,_std::allocator<rr::FragmentOutputInfo>_>.
            _M_impl.super__Vector_impl_data._M_start;
  uVar2 = (state->viewport).rect.left;
  uVar5 = (state->viewport).rect.bottom;
  local_358._4_4_ = uVar5;
  local_358._0_4_ = uVar2;
  local_358._8_8_ = 0;
  uVar3 = (state->viewport).rect.width;
  uVar6 = (state->viewport).rect.height;
  local_338._4_4_ = uVar6;
  local_338._0_4_ = uVar3;
  _fStack_330 = 0;
  local_2f8 = primList;
  MultisampleConstPixelBufferAccess::MultisampleConstPixelBufferAccess
            ((MultisampleConstPixelBufferAccess *)&visiblePoints,
             (MultisamplePixelBufferAccess *)local_320);
  local_238.m_data[0] = -(uint)(0 < (int)local_358._0_4_) & local_358._0_4_;
  local_238.m_data[1] = -(uint)(0 < (int)local_358._4_4_) & local_358._4_4_;
  uVar23 = -(uint)((int)(local_338._0_4_ + local_358._0_4_) <
                  (int)visiblePoints.
                       super__Vector_base<rr::pa::Point,_std::allocator<rr::pa::Point>_>._M_impl.
                       super__Vector_impl_data._M_finish._4_4_);
  uVar27 = -(uint)((int)(local_338._4_4_ + local_358._4_4_) <
                  (int)(uint)visiblePoints.
                             super__Vector_base<rr::pa::Point,_std::allocator<rr::pa::Point>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage);
  local_238.m_data[2] =
       (~uVar23 & visiblePoints.super__Vector_base<rr::pa::Point,_std::allocator<rr::pa::Point>_>.
                  _M_impl.super__Vector_impl_data._M_finish._4_4_ |
       local_338._0_4_ + local_358._0_4_ & uVar23) - local_238.m_data[0];
  local_238.m_data[3] =
       (~uVar27 & (uint)visiblePoints.
                        super__Vector_base<rr::pa::Point,_std::allocator<rr::pa::Point>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage |
       local_338._4_4_ + local_358._4_4_ & uVar27) - local_238.m_data[1];
  fragmentPackets = (FragmentPacket *)operator_new(0x2000);
  local_358._0_8_ = fragmentPackets + 0x80;
  memset(fragmentPackets,0,0x2000);
  std::vector<rr::GenericVec4,_std::allocator<rr::GenericVec4>_>::vector
            (&local_318,((long)pFVar9 - (long)pFVar10) * 0x40000000 >> 0x17,
             (allocator_type *)&visiblePoints);
  pFVar14 = (pointer)operator_new(0x7000);
  lVar18 = 0;
  do {
    *(undefined8 *)((long)(&pFVar14->pixelCoord + 6) + lVar18) = 0;
    *(undefined1 (*) [16])((long)(pFVar14->pixelCoord).m_data + lVar18) = (undefined1  [16])0x0;
    *(undefined1 (*) [16])((long)(&pFVar14->pixelCoord + 2) + lVar18) = (undefined1  [16])0x0;
    *(undefined1 (*) [16])((long)&((GenericVec4 *)(&pFVar14->pixelCoord + 3))->v + lVar18 + 4) =
         (undefined1  [16])0x0;
    lVar18 = lVar18 + 0x38;
  } while (lVar18 != 0x7000);
  local_338 = (undefined1  [8])(pFVar14 + 0x200);
  local_2e8 = (undefined1  [16])0x0;
  local_2d8 = (pointer)0x0;
  local_288 = (pointer)0x0;
  local_298 = (undefined1  [16])0x0;
  stack0xfffffffffffffd58 = (undefined1  [16])0x0;
  _local_2b8 = (undefined1  [16])0x0;
  local_2c8 = (undefined1  [16])0x0;
  MultisampleConstPixelBufferAccess::MultisampleConstPixelBufferAccess
            ((MultisampleConstPixelBufferAccess *)&visiblePoints,&local_320->m_depthBuffer);
  if ((((int)visiblePoints.super__Vector_base<rr::pa::Point,_std::allocator<rr::pa::Point>_>._M_impl
             .super__Vector_impl_data._M_finish == 0) ||
      (visiblePoints.super__Vector_base<rr::pa::Point,_std::allocator<rr::pa::Point>_>._M_impl.
       super__Vector_impl_data._M_finish._4_4_ == 0)) ||
     ((uint)visiblePoints.super__Vector_base<rr::pa::Point,_std::allocator<rr::pa::Point>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage == 0)) {
    fragmentDepths_ = (float *)0x0;
  }
  else {
    std::vector<float,_std::allocator<float>_>::resize
              ((vector<float,_std::allocator<float>_> *)local_2e8,(long)iVar7 << 9);
    fragmentDepths_ = (float *)local_2e8._0_8_;
  }
  local_2c8._8_8_ = local_358._0_8_;
  local_2c8._0_8_ = fragmentPackets;
  local_270 = local_318.super__Vector_base<rr::GenericVec4,_std::allocator<rr::GenericVec4>_>.
              _M_impl.super__Vector_impl_data._M_start;
  auStack_2b0._0_8_ =
       local_318.super__Vector_base<rr::GenericVec4,_std::allocator<rr::GenericVec4>_>._M_impl.
       super__Vector_impl_data._M_start;
  local_2b8 = (undefined1  [8])local_358._0_8_;
  pGStack_2a0 = local_318.super__Vector_base<rr::GenericVec4,_std::allocator<rr::GenericVec4>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage;
  local_318.super__Vector_base<rr::GenericVec4,_std::allocator<rr::GenericVec4>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_318.super__Vector_base<rr::GenericVec4,_std::allocator<rr::GenericVec4>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_318.super__Vector_base<rr::GenericVec4,_std::allocator<rr::GenericVec4>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_298._8_8_ = pFVar14 + 0x200;
  local_298._0_8_ = pFVar14;
  local_288 = (pointer)local_338;
  local_328 = (local_2f8->super__Vector_base<rr::pa::Point,_std::allocator<rr::pa::Point>_>)._M_impl
              .super__Vector_impl_data._M_start;
  local_280 = fragmentDepths_;
  if (local_328 !=
      (local_2f8->super__Vector_base<rr::pa::Point,_std::allocator<rr::pa::Point>_>)._M_impl.
      super__Vector_impl_data._M_finish) {
    local_2f0 = &state->rasterization;
LAB_00598734:
    iVar7 = *(int *)&local_320->field_0x8;
    _local_338 = ZEXT416((uint)(state->viewport).zn);
    local_358 = ZEXT416((uint)(state->viewport).zf);
    TriangleRasterizer::TriangleRasterizer
              ((TriangleRasterizer *)&visiblePoints,&local_238,iVar7,local_2f0);
    TriangleRasterizer::TriangleRasterizer(&rasterizer2,&local_238,iVar7,local_2f0);
    pVVar11 = local_328->v0;
    fVar24 = pVVar11->pointSize * 0.5;
    uVar4 = *(undefined8 *)(pVVar11->position).m_data;
    local_248 = (float)uVar4;
    local_258 = fVar24 + local_248;
    local_254 = (float)((ulong)uVar4 >> 0x20);
    local_244 = fVar24 + local_254;
    local_268 = CONCAT44(local_244,local_258);
    local_260 = *(undefined8 *)((pVVar11->position).m_data + 2);
    local_248 = local_248 - fVar24;
    local_254 = local_254 - fVar24;
    local_228 = CONCAT44(local_254,local_248);
    local_250 = local_260;
    local_240 = local_260;
    uStack_220 = local_260;
    TriangleRasterizer::init((TriangleRasterizer *)&visiblePoints,(EVP_PKEY_CTX *)&local_268);
    TriangleRasterizer::init(&rasterizer2,(EVP_PKEY_CTX *)&local_268);
    FragmentShadingContext::FragmentShadingContext
              (&shadingContext,local_328->v0->outputs,(GenericVec4 *)0x0,(GenericVec4 *)0x0,
               local_270,fragmentDepths_,
               (int)((ulong)((long)(program->fragmentShader->m_outputs).
                                   super__Vector_base<rr::FragmentOutputInfo,_std::allocator<rr::FragmentOutputInfo>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                            (long)(program->fragmentShader->m_outputs).
                                  super__Vector_base<rr::FragmentOutputInfo,_std::allocator<rr::FragmentOutputInfo>_>
                                  ._M_impl.super__Vector_impl_data._M_start) >> 2),iVar7,0,
               in_stack_fffffffffffffc98);
    auVar25._0_4_ =
         ~-(uint)((float)local_338._0_4_ <= (float)local_358._0_4_) & local_358._0_4_ |
         -(uint)((float)local_338._0_4_ <= (float)local_358._0_4_) & local_338._0_4_;
    local_358._4_4_ =
         ~-(uint)((float)local_358._0_4_ <= (float)local_338._0_4_) & local_358._0_4_ |
         local_338._0_4_ & -(uint)((float)local_358._0_4_ <= (float)local_338._0_4_);
    auVar25._4_4_ = auVar25._0_4_;
    auVar25._8_4_ = auVar25._0_4_;
    auVar25._12_4_ = auVar25._0_4_;
    local_358._0_4_ = local_358._4_4_;
    local_358._8_4_ = local_358._4_4_;
    local_358._12_4_ = local_358._4_4_;
    _local_338 = auVar25;
    do {
      numRasterizedPackets = 0;
      TriangleRasterizer::rasterize
                ((TriangleRasterizer *)&visiblePoints,fragmentPackets,fragmentDepths_,0x80,
                 &numRasterizedPackets);
      uVar15 = 0x80;
      if ((long)numRasterizedPackets != 0x80) {
        pfVar16 = fragmentDepths_ + numRasterizedPackets * iVar7 * 4;
        if (fragmentDepths_ == (float *)0x0) {
          pfVar16 = (float *)0x0;
        }
        local_33c = 0;
        TriangleRasterizer::rasterize
                  (&rasterizer2,
                   (FragmentPacket *)((long)numRasterizedPackets * 0x40 + local_2c8._0_8_),pfVar16,
                   0x80 - numRasterizedPackets,&local_33c);
        numRasterizedPackets = numRasterizedPackets + local_33c;
        uVar15 = (ulong)(uint)numRasterizedPackets;
        if (numRasterizedPackets == 0) goto LAB_00598a21;
      }
      (**program->fragmentShader->_vptr_FragmentShader)
                (program->fragmentShader,fragmentPackets,uVar15);
      if (fragmentDepths_ != (float *)0x0) {
        if (((state->fragOps).depthClampEnabled == true) &&
           (uVar23 = numRasterizedPackets * iVar7 * 4, 0 < (int)uVar23)) {
          uVar15 = 0;
          do {
            auVar25 = *(undefined1 (*) [16])(fragmentDepths_ + uVar15);
            auVar26 = minps(local_358,auVar25);
            uVar27 = -(uint)(auVar25._0_4_ < (float)local_338._0_4_);
            uVar20 = -(uint)(auVar25._4_4_ < (float)local_338._4_4_);
            uVar21 = -(uint)(auVar25._8_4_ < fStack_330);
            uVar22 = -(uint)(auVar25._12_4_ < fStack_32c);
            pfVar16 = fragmentDepths_ + uVar15;
            *pfVar16 = (float)(~uVar27 & auVar26._0_4_ | local_338._0_4_ & uVar27);
            pfVar16[1] = (float)(~uVar20 & auVar26._4_4_ | local_338._4_4_ & uVar20);
            pfVar16[2] = (float)(~uVar21 & auVar26._8_4_ | (uint)fStack_330 & uVar21);
            pfVar16[3] = (float)(~uVar22 & auVar26._12_4_ | (uint)fStack_32c & uVar22);
            uVar15 = uVar15 + 4;
          } while (uVar23 != uVar15);
        }
      }
      anon_unknown_19::writeFragmentPackets
                ((anon_unknown_19 *)state,(RenderState *)local_320,
                 (RenderTarget *)
                 (program->fragmentShader->m_outputs).
                 super__Vector_base<rr::FragmentOutputInfo,_std::allocator<rr::FragmentOutputInfo>_>
                 ._M_impl.super__Vector_impl_data._M_start,
                 (Program *)
                 (program->fragmentShader->m_outputs).
                 super__Vector_base<rr::FragmentOutputInfo,_std::allocator<rr::FragmentOutputInfo>_>
                 ._M_impl.super__Vector_impl_data._M_finish,fragmentPackets,numRasterizedPackets,
                 FACETYPE_FRONT,
                 (vector<rr::GenericVec4,_std::allocator<rr::GenericVec4>_> *)(local_2b8 + 8),
                 fragmentDepths_,(vector<rr::Fragment,_std::allocator<rr::Fragment>_> *)local_298);
    } while( true );
  }
LAB_00598a53:
  operator_delete(pFVar14,(long)local_288 - (long)pFVar14);
LAB_00598a5e:
  if ((void *)auStack_2b0._0_8_ != (void *)0x0) {
    operator_delete((void *)auStack_2b0._0_8_,(long)pGStack_2a0 - auStack_2b0._0_8_);
  }
  if ((void *)local_2c8._0_8_ != (void *)0x0) {
    operator_delete((void *)local_2c8._0_8_,(long)local_2b8 - local_2c8._0_8_);
  }
  if ((pointer)local_2e8._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_2e8._0_8_,(long)local_2d8 - local_2e8._0_8_);
  }
  if (local_318.super__Vector_base<rr::GenericVec4,_std::allocator<rr::GenericVec4>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_318.super__Vector_base<rr::GenericVec4,_std::allocator<rr::GenericVec4>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_318.
                          super__Vector_base<rr::GenericVec4,_std::allocator<rr::GenericVec4>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_318.
                          super__Vector_base<rr::GenericVec4,_std::allocator<rr::GenericVec4>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return;
LAB_00598a21:
  local_328 = local_328 + 1;
  numRasterizedPackets = 0;
  if (local_328 ==
      (local_2f8->super__Vector_base<rr::pa::Point,_std::allocator<rr::pa::Point>_>)._M_impl.
      super__Vector_impl_data._M_finish) goto code_r0x00598a3e;
  goto LAB_00598734;
code_r0x00598a3e:
  numRasterizedPackets = 0;
  pFVar14 = (pointer)local_298._0_8_;
  if ((pointer)local_298._0_8_ == (pointer)0x0) goto LAB_00598a5e;
  goto LAB_00598a53;
}

Assistant:

void drawBasicPrimitives (const RenderState& state, const RenderTarget& renderTarget, const Program& program, ContainerType& primList, VertexPacketAllocator& vpalloc)
{
	const bool clipZ = !state.fragOps.depthClampEnabled;

	// Transform feedback

	// Flatshading
	flatshadeVertices(program, primList);

	// Clipping
	// \todo [jarkko] is creating & swapping std::vectors really a good solution?
	clipPrimitives(primList, program, clipZ, vpalloc);

	// Transform vertices to window coords
	transformClipCoordsToWindowCoords(state, primList);

	// Rasterize and paint
	rasterize(state, renderTarget, program, primList);
}